

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O1

void brotli::BuildBlockHistograms<brotli::Histogram<256>,unsigned_char>
               (uchar *data,size_t length,uint8_t *block_ids,
               vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_> *histograms)

{
  uint32_t *puVar1;
  size_t *psVar2;
  byte bVar3;
  pointer pHVar4;
  size_t sVar5;
  
  sVar5 = RemapBlockIds(block_ids,length);
  if (sVar5 < 0x101) {
    pHVar4 = (histograms->
             super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((histograms->
        super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>).
        _M_impl.super__Vector_impl_data._M_finish != pHVar4) {
      (histograms->
      super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>)._M_impl.
      super__Vector_impl_data._M_finish = pHVar4;
    }
    std::vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>::resize
              (histograms,sVar5);
    if (length != 0) {
      pHVar4 = (histograms->
               super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      sVar5 = 0;
      do {
        bVar3 = block_ids[sVar5];
        puVar1 = pHVar4[bVar3].data_ + data[sVar5];
        *puVar1 = *puVar1 + 1;
        psVar2 = &pHVar4[bVar3].total_count_;
        *psVar2 = *psVar2 + 1;
        sVar5 = sVar5 + 1;
      } while (length != sVar5);
    }
    return;
  }
  __assert_fail("num_types <= 256",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/block_splitter.cc"
                ,0x100,
                "void brotli::BuildBlockHistograms(const DataType *, const size_t, uint8_t *, std::vector<HistogramType> *) [HistogramType = brotli::Histogram<256>, DataType = unsigned char]"
               );
}

Assistant:

void BuildBlockHistograms(const DataType* data, const size_t length,
                          uint8_t* block_ids,
                          std::vector<HistogramType>* histograms) {
  size_t num_types = RemapBlockIds(block_ids, length);
  assert(num_types <= 256);
  histograms->clear();
  histograms->resize(num_types);
  for (size_t i = 0; i < length; ++i) {
    (*histograms)[block_ids[i]].Add(data[i]);
  }
}